

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_VRR_Writer::WriteVRR_Inline_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  OSTEI_VRR_Algorithm_Base *pOVar1;
  int iVar2;
  OSTEI_VRR_Writer *this_00;
  OSTEI_VRR_Writer local_100;
  undefined1 local_e0 [48];
  undefined1 local_b0 [48];
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  local_80;
  undefined1 local_50 [48];
  
  QAM::QAM((QAM *)local_50,am);
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_b0,am);
  OSTEI_VRR_Algorithm_Base::GetSteps((VRR_StepSet *)&local_80,pOVar1,(QAM *)local_b0);
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_e0,am);
  iVar2 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar1,(QAM *)local_e0);
  this_00 = &local_100;
  std::__cxx11::to_string((string *)this_00,iVar2 + 1);
  WriteVRRSteps_(this_00,os,(QAM *)local_50,(VRR_StepSet *)&local_80,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)(local_e0 + 0x10));
  std::
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  ::~_Rb_tree(&local_80);
  std::__cxx11::string::~string((string *)(local_b0 + 0x10));
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_Inline_(std::ostream & os, QAM am) const
{
    WriteVRRSteps_(os, am, vrr_algo_.GetSteps(am), 
                   std::to_string(vrr_algo_.GetMReq(am)+1));
}